

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O1

REF_STATUS ref_collapse_pass(REF_GRID ref_grid)

{
  REF_DBL *pRVar1;
  int iVar2;
  REF_CELL pRVar3;
  REF_ADAPT pRVar4;
  REF_ADJ_ITEM pRVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  REF_CELL *ppRVar9;
  REF_DBL *original;
  void *pvVar10;
  void *__ptr;
  long lVar11;
  undefined8 uVar12;
  REF_STATUS RVar13;
  REF_GRID ref_grid_00;
  REF_NODE ref_node;
  REF_INT *__ptr_00;
  char *pcVar14;
  REF_INT RVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  double dVar19;
  REF_EDGE ref_edge;
  REF_DBL edge_ratio;
  REF_INT nodes [27];
  REF_STATUS local_f0;
  REF_INT local_ec;
  REF_INT *local_e8;
  REF_GRID local_e0;
  REF_CELL local_d8;
  REF_EDGE local_d0;
  REF_NODE local_c8;
  void *local_c0;
  ulong local_b8;
  double local_b0;
  REF_INT local_a8 [30];
  
  ref_node = ref_grid->node;
  ppRVar9 = ref_grid->cell + 3;
  if (ref_grid->surf == 0) {
    ppRVar9 = ref_grid->cell + 8;
  }
  pRVar3 = *ppRVar9;
  uVar7 = ref_edge_create(&local_d0,ref_grid);
  if (uVar7 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",0x68
           ,"ref_collapse_pass",(ulong)uVar7,"orig edges");
    return uVar7;
  }
  iVar2 = ref_node->max;
  lVar16 = (long)iVar2;
  if (lVar16 < 0) {
    local_f0 = 1;
    pcVar14 = "malloc ratio of REF_DBL negative";
LAB_00185948:
    bVar6 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",0x6b
           ,"ref_collapse_pass",pcVar14);
    original = (REF_DBL *)0x0;
  }
  else {
    original = (REF_DBL *)malloc(lVar16 * 8);
    if (original == (REF_DBL *)0x0) {
      local_f0 = 2;
      pcVar14 = "malloc ratio of REF_DBL NULL";
      goto LAB_00185948;
    }
    bVar6 = true;
    local_f0 = 0;
    if (iVar2 != 0) {
      pRVar4 = ref_grid->adapt;
      lVar11 = 0;
      do {
        dVar19 = pRVar4->collapse_ratio;
        original[lVar11] = dVar19 + dVar19;
        lVar11 = lVar11 + 1;
      } while (lVar16 != lVar11);
    }
  }
  if (!bVar6) {
    return local_f0;
  }
  RVar15 = local_ec;
  local_e0 = ref_grid;
  local_d8 = pRVar3;
  if (0 < local_d0->n) {
    lVar16 = 0;
    do {
      RVar15 = local_d0->e2n[lVar16 * 2];
      iVar2 = local_d0->e2n[lVar16 * 2 + 1];
      uVar7 = ref_node_ratio(ref_node,RVar15,iVar2,&local_b0);
      if (uVar7 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x70,"ref_collapse_pass",(ulong)uVar7,"ratio");
        return uVar7;
      }
      dVar19 = original[RVar15];
      if (local_b0 <= original[RVar15]) {
        dVar19 = local_b0;
      }
      original[RVar15] = dVar19;
      dVar19 = original[iVar2];
      if (local_b0 <= original[iVar2]) {
        dVar19 = local_b0;
      }
      original[iVar2] = dVar19;
      lVar16 = lVar16 + 1;
    } while (lVar16 < local_d0->n);
  }
  local_ec = RVar15;
  if ((long)ref_node->n < 0) {
    pcVar14 = "malloc target of REF_INT negative";
    uVar12 = 0x75;
LAB_00185ad7:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
           uVar12,"ref_collapse_pass",pcVar14);
    RVar13 = 1;
  }
  else {
    pvVar10 = malloc((long)ref_node->n << 2);
    if (pvVar10 == (void *)0x0) {
      pcVar14 = "malloc target of REF_INT NULL";
      uVar12 = 0x75;
    }
    else {
      if ((long)ref_node->max < 0) {
        local_f0 = 1;
        pcVar14 = "malloc node2target of REF_INT negative";
LAB_00185b3f:
        ref_grid_00 = local_e0;
        __ptr = (void *)0x0;
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x76,"ref_collapse_pass",pcVar14);
        bVar6 = false;
      }
      else {
        __ptr = malloc((long)ref_node->max << 2);
        if (__ptr == (void *)0x0) {
          local_f0 = 2;
          pcVar14 = "malloc node2target of REF_INT NULL";
          goto LAB_00185b3f;
        }
        bVar6 = true;
        ref_grid_00 = local_e0;
        if (0 < ref_node->max) {
          lVar16 = 0;
          do {
            *(undefined4 *)((long)__ptr + lVar16 * 4) = 0xffffffff;
            lVar16 = lVar16 + 1;
          } while (lVar16 < ref_node->max);
        }
      }
      if (!bVar6) {
        return local_f0;
      }
      if (ref_node->max < 1) {
        uVar7 = 0;
      }
      else {
        pRVar4 = ref_grid_00->adapt;
        lVar16 = 0;
        uVar7 = 0;
        do {
          dVar19 = original[lVar16];
          if (dVar19 < pRVar4->collapse_ratio) {
            *(uint *)((long)__ptr + lVar16 * 4) = uVar7;
            *(int *)((long)pvVar10 + (long)(int)uVar7 * 4) = (int)lVar16;
            original[(int)uVar7] = dVar19;
            uVar7 = uVar7 + 1;
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 < ref_node->max);
      }
      if ((int)uVar7 < 0) {
        pcVar14 = "malloc order of REF_INT negative";
        uVar12 = 0x81;
        goto LAB_00185ad7;
      }
      local_e8 = (REF_INT *)malloc((ulong)uVar7 << 2);
      if (local_e8 != (REF_INT *)0x0) {
        local_c0 = pvVar10;
        uVar8 = ref_sort_heap_dbl(uVar7,original,local_e8);
        if (uVar8 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                 ,0x83,"ref_collapse_pass",(ulong)uVar8,"sort lengths");
          return uVar8;
        }
        __ptr_00 = local_e8;
        if (uVar7 != 0) {
          local_b8 = 1;
          if (1 < (int)uVar7) {
            local_b8 = (ulong)uVar7;
          }
          uVar18 = 0;
          local_c8 = ref_node;
          do {
            pRVar1 = &ref_grid_00->adapt->collapse_ratio;
            if (original[__ptr_00[uVar18]] < *pRVar1 || original[__ptr_00[uVar18]] == *pRVar1) {
              iVar2 = *(int *)((long)local_c0 + (long)__ptr_00[uVar18] * 4);
              lVar16 = (long)iVar2;
              if (((-1 < lVar16) && (iVar2 < ref_node->max)) && (-1 < ref_node->global[lVar16])) {
                uVar7 = ref_collapse_to_remove_node1(ref_grid_00,&local_ec,iVar2);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                         ,0x89,"ref_collapse_pass",(ulong)uVar7,"collapse rm");
                  return uVar7;
                }
                if ((local_c8->max <= iVar2) ||
                   (ref_grid_00 = local_e0, ref_node = local_c8, __ptr_00 = local_e8,
                   local_c8->global[lVar16] < 0)) {
                  lVar16 = (long)local_ec;
                  local_c8->age[lVar16] = 0;
                  RVar15 = -1;
                  uVar17 = 0xffffffff;
                  if (-1 < lVar16) {
                    uVar17 = 0xffffffff;
                    if (local_ec < local_d8->ref_adj->nnode) {
                      uVar17 = (ulong)(uint)local_d8->ref_adj->first[lVar16];
                    }
                  }
                  if ((int)uVar17 != -1) {
                    RVar15 = local_d8->ref_adj->item[(int)uVar17].ref;
                  }
                  while (ref_grid_00 = local_e0, ref_node = local_c8, __ptr_00 = local_e8,
                        (int)uVar17 != -1) {
                    uVar7 = ref_cell_nodes(local_d8,RVar15,local_a8);
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                             ,0x8d,"ref_collapse_pass",(ulong)uVar7,"cell nodes");
                      return uVar7;
                    }
                    iVar2 = local_d8->node_per;
                    if (0 < (long)iVar2) {
                      lVar16 = 0;
                      do {
                        lVar11 = (long)*(int *)((long)__ptr + (long)local_a8[lVar16] * 4);
                        if (lVar11 != -1) {
                          dVar19 = local_e0->adapt->collapse_ratio;
                          original[lVar11] = dVar19 + dVar19;
                        }
                        lVar16 = lVar16 + 1;
                      } while (iVar2 != lVar16);
                    }
                    pRVar5 = local_d8->ref_adj->item;
                    uVar17 = (ulong)pRVar5[(int)uVar17].next;
                    if (uVar17 == 0xffffffffffffffff) {
                      RVar15 = -1;
                    }
                    else {
                      RVar15 = pRVar5[uVar17].ref;
                    }
                  }
                }
              }
            }
            uVar18 = uVar18 + 1;
          } while (uVar18 != local_b8);
        }
        free(__ptr_00);
        pvVar10 = local_c0;
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
        free(pvVar10);
        if (original != (REF_DBL *)0x0) {
          free(original);
        }
        ref_edge_free(local_d0);
        return 0;
      }
      pcVar14 = "malloc order of REF_INT NULL";
      uVar12 = 0x81;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
           uVar12,"ref_collapse_pass",pcVar14);
    RVar13 = 2;
  }
  return RVar13;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_pass(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_EDGE ref_edge;
  REF_DBL *ratio;
  REF_INT *order;
  REF_INT ntarget, *target, *node2target;
  REF_INT node, node0, node1;
  REF_INT i, edge;
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL edge_ratio;

  if (ref_grid_surf(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
  } else {
    ref_cell = ref_grid_tet(ref_grid);
  }

  RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");

  ref_malloc_init(ratio, ref_node_max(ref_node), REF_DBL,
                  2.0 * ref_grid_adapt(ref_grid, collapse_ratio));

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    RSS(ref_node_ratio(ref_node, node0, node1, &edge_ratio), "ratio");
    ratio[node0] = MIN(ratio[node0], edge_ratio);
    ratio[node1] = MIN(ratio[node1], edge_ratio);
  }

  ref_malloc(target, ref_node_n(ref_node), REF_INT);
  ref_malloc_init(node2target, ref_node_max(ref_node), REF_INT, REF_EMPTY);

  ntarget = 0;
  for (node = 0; node < ref_node_max(ref_node); node++)
    if (ratio[node] < ref_grid_adapt(ref_grid, collapse_ratio)) {
      node2target[node] = ntarget;
      target[ntarget] = node;
      ratio[ntarget] = ratio[node];
      ntarget++;
    }

  ref_malloc(order, ntarget, REF_INT);

  RSS(ref_sort_heap_dbl(ntarget, ratio, order), "sort lengths");

  for (i = 0; i < ntarget; i++) {
    if (ratio[order[i]] > ref_grid_adapt(ref_grid, collapse_ratio)) continue;
    node1 = target[order[i]];
    if (!ref_node_valid(ref_node, node1)) continue;
    RSS(ref_collapse_to_remove_node1(ref_grid, &node0, node1), "collapse rm");
    if (!ref_node_valid(ref_node, node1)) {
      ref_node_age(ref_node, node0) = 0;
      each_ref_cell_having_node(ref_cell, node0, item, cell) {
        RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
        for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
          if (REF_EMPTY != node2target[nodes[node]]) {
            ratio[node2target[nodes[node]]] =
                2.0 * ref_grid_adapt(ref_grid, collapse_ratio);
          }
        }
      }
    }
  }

  ref_free(order);
  ref_free(node2target);
  ref_free(target);
  ref_free(ratio);

  ref_edge_free(ref_edge);

  return REF_SUCCESS;
}